

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

QList<QBenchmarkMeasurerBase::Measurement> * __thiscall
QBenchmarkCallgrindMeasurer::stop(QBenchmarkCallgrindMeasurer *this)

{
  initializer_list<QBenchmarkMeasurerBase::Measurement> args;
  qint64 qVar1;
  QList<QBenchmarkMeasurerBase::Measurement> *in_RDI;
  long in_FS_OFFSET;
  qint64 result;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  Measurement local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0x43540000;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  uStack_10 = 0;
  qVar1 = QBenchmarkValgrindUtils::extractLastResult();
  local_48.value = (qreal)qVar1;
  local_48.metric = InstructionReads;
  args._M_len = 1;
  args._M_array = &local_48;
  QList<QBenchmarkMeasurerBase::Measurement>::QList(in_RDI,args);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QBenchmarkMeasurerBase::Measurement> QBenchmarkCallgrindMeasurer::stop()
{
    CALLGRIND_DUMP_STATS;
    const qint64 result = QBenchmarkValgrindUtils::extractLastResult();
    return { { qreal(result), QTest::InstructionReads } };
}